

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O3

void __thiscall QJsonValue::QJsonValue(QJsonValue *this,double v)

{
  if ((ABS(v) <= 9007199254740992.0) && (v == (double)(long)v)) {
    (this->value).n = (long)v;
    (this->value).container = (QCborContainerPrivate *)0x0;
    (this->value).t = Integer;
    return;
  }
  (this->value).container = (QCborContainerPrivate *)0x0;
  (this->value).t = Double;
  (this->value).n = (qint64)v;
  return;
}

Assistant:

QJsonValue::QJsonValue(double v)
    : value(doubleValueHelper(v))
{
}